

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::GenerateTargetManifest(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  int iVar2;
  cmMakefile *this_00;
  cmGlobalGenerator *this_01;
  ulong uVar3;
  string local_138;
  undefined1 local_118 [8];
  string f;
  string dir;
  undefined1 local_c8 [8];
  string pdbName;
  string impName;
  string realName;
  string soName;
  string name;
  cmGlobalGenerator *gg;
  cmMakefile *mf;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = cmTarget::IsImported(this->Target);
  if (bVar1) {
    return;
  }
  this_00 = cmTarget::GetMakefile(this->Target);
  this_01 = cmMakefile::GetGlobalGenerator(this_00);
  std::__cxx11::string::string((string *)(soName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(realName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(impName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(pdbName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_c8);
  iVar2 = GetType(this);
  if (iVar2 == 0) {
    cmTarget::GetExecutableNames
              (this->Target,(string *)((long)&soName.field_2 + 8),
               (string *)((long)&impName.field_2 + 8),(string *)((long)&pdbName.field_2 + 8),
               (string *)local_c8,config);
  }
  else {
    iVar2 = GetType(this);
    if (((iVar2 != 1) && (iVar2 = GetType(this), iVar2 != 2)) && (iVar2 = GetType(this), iVar2 != 3)
       ) goto LAB_005dbb3c;
    cmTarget::GetLibraryNames
              (this->Target,(string *)((long)&soName.field_2 + 8),
               (string *)((long)&realName.field_2 + 8),(string *)((long)&impName.field_2 + 8),
               (string *)((long)&pdbName.field_2 + 8),(string *)local_c8,config);
  }
  cmTarget::GetDirectory((string *)((long)&f.field_2 + 8),this->Target,config,false);
  std::__cxx11::string::string((string *)local_118);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_118,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_118,"/");
    std::__cxx11::string::operator+=
              ((string *)local_118,(string *)(soName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_01,config,(string *)local_118);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_118,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_118,"/");
    std::__cxx11::string::operator+=
              ((string *)local_118,(string *)(realName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_01,config,(string *)local_118);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_118,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_118,"/");
    std::__cxx11::string::operator+=
              ((string *)local_118,(string *)(impName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_01,config,(string *)local_118);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_118,(string *)(f.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_118,"/");
    std::__cxx11::string::operator+=((string *)local_118,(string *)local_c8);
    cmGlobalGenerator::AddToManifest(this_01,config,(string *)local_118);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmTarget::GetDirectory(&local_138,this->Target,config,true);
    std::__cxx11::string::operator=((string *)local_118,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::operator+=((string *)local_118,"/");
    std::__cxx11::string::operator+=
              ((string *)local_118,(string *)(pdbName.field_2._M_local_buf + 8));
    cmGlobalGenerator::AddToManifest(this_01,config,(string *)local_118);
  }
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(f.field_2._M_local_buf + 8));
LAB_005dbb3c:
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)(pdbName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(impName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(realName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soName.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGeneratorTarget::GenerateTargetManifest(
                                              const std::string& config) const
{
  if (this->Target->IsImported())
    {
    return;
    }
  cmMakefile* mf = this->Target->GetMakefile();
  cmGlobalGenerator* gg = mf->GetGlobalGenerator();

  // Get the names.
  std::string name;
  std::string soName;
  std::string realName;
  std::string impName;
  std::string pdbName;
  if(this->GetType() == cmTarget::EXECUTABLE)
    {
    this->Target->GetExecutableNames(name, realName, impName, pdbName,
                                     config);
    }
  else if(this->GetType() == cmTarget::STATIC_LIBRARY ||
          this->GetType() == cmTarget::SHARED_LIBRARY ||
          this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    this->Target->GetLibraryNames(name, soName, realName, impName, pdbName,
                                  config);
    }
  else
    {
    return;
    }

  // Get the directory.
  std::string dir = this->Target->GetDirectory(config, false);

  // Add each name.
  std::string f;
  if(!name.empty())
    {
    f = dir;
    f += "/";
    f += name;
    gg->AddToManifest(config, f);
    }
  if(!soName.empty())
    {
    f = dir;
    f += "/";
    f += soName;
    gg->AddToManifest(config, f);
    }
  if(!realName.empty())
    {
    f = dir;
    f += "/";
    f += realName;
    gg->AddToManifest(config, f);
    }
  if(!pdbName.empty())
    {
    f = dir;
    f += "/";
    f += pdbName;
    gg->AddToManifest(config, f);
    }
  if(!impName.empty())
    {
    f = this->Target->GetDirectory(config, true);
    f += "/";
    f += impName;
    gg->AddToManifest(config, f);
    }
}